

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyConcaveCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall btSoftBodyTriangleCallback::clearCache(btSoftBodyTriangleCallback *this)

{
  btTriIndex *pbVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  
  if (0 < (this->m_shapeCache).m_valueArray.m_size) {
    lVar3 = 8;
    lVar4 = 0;
    do {
      pbVar1 = (this->m_shapeCache).m_valueArray.m_data;
      btSparseSdf<3>::RemoveReferences
                (&this->m_softBody->m_worldInfo->m_sparsesdf,
                 *(btCollisionShape **)((long)&pbVar1->m_PartIdTriangleIndex + lVar3));
      plVar2 = *(long **)((long)&pbVar1->m_PartIdTriangleIndex + lVar3);
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 8))();
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar4 < (this->m_shapeCache).m_valueArray.m_size);
  }
  btHashMap<btHashKey<btTriIndex>,_btTriIndex>::clear(&this->m_shapeCache);
  return;
}

Assistant:

void	btSoftBodyTriangleCallback::clearCache()
{
	for (int i=0;i<m_shapeCache.size();i++)
	{
		btTriIndex* tmp = m_shapeCache.getAtIndex(i);
		btAssert(tmp);
		btAssert(tmp->m_childShape);
		m_softBody->getWorldInfo()->m_sparsesdf.RemoveReferences(tmp->m_childShape);//necessary?
		delete tmp->m_childShape;
	}
	m_shapeCache.clear();
}